

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

double sexp_bignum_to_double(sexp a)

{
  undefined8 uVar1;
  sexp_uint_t sVar2;
  double dVar3;
  
  sVar2 = sexp_bignum_hi(a);
  dVar3 = 0.0;
  while (-1 < (long)(sVar2 - 1)) {
    uVar1 = *(undefined8 *)((long)&a->value + sVar2 * 8 + 8);
    dVar3 = dVar3 * 1.8446744073709552e+19 +
            ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    sVar2 = sVar2 - 1;
  }
  return dVar3 * (double)(int)(a->value).flonum_bits[0];
}

Assistant:

double sexp_bignum_to_double (sexp a) {
  double res = 0;
  sexp_sint_t i;
  sexp_uint_t *data=sexp_bignum_data(a);
  for (i=sexp_bignum_hi(a)-1; i>=0; i--)
    res = res * ((double)SEXP_UINT_T_MAX+1) + data[i];
  return res * sexp_bignum_sign(a);
}